

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O3

void SetConversation(int convid,PClassActor *Class,int dlgindex)

{
  Node *pNVar1;
  Node *pNVar2;
  FName local_14;
  
  if (convid != -1) {
    pNVar1 = TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::GetNode(&DialogueRoots,convid);
    (pNVar1->Pair).Value = dlgindex;
  }
  if (Class != (PClassActor *)0x0) {
    pNVar2 = TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::GetNode
                       (&ClassRoots,&local_14);
    (pNVar2->Pair).Value = dlgindex;
  }
  return;
}

Assistant:

void SetConversation(int convid, PClassActor *Class, int dlgindex)
{
	if (convid != -1)
	{
		DialogueRoots[convid] = dlgindex;
	}
	if (Class != NULL)
	{
		ClassRoots[Class->TypeName] = dlgindex;
	}
}